

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logreplay.c
# Opt level: O1

void make_checkpoint(int actions)

{
  long lVar1;
  replay_checkpoint *prVar2;
  nh_option_desc *pnVar3;
  
  if (0 < (long)cpcount) {
    if (actions <= checkpoints[(long)cpcount + -1].actions + 1000) {
      return;
    }
    lVar1 = true_moves();
    if (lVar1 <= checkpoints[(long)cpcount + -1].moves) {
      return;
    }
  }
  if ((multi == 0) && (occupation == (_func_int *)0x0)) {
    replay_sync_save();
    lVar1 = (long)cpcount;
    cpcount = (int)(lVar1 + 1);
    prVar2 = (replay_checkpoint *)realloc(checkpoints,(lVar1 + 1) * 0x1fd8);
    checkpoints = prVar2;
    prVar2[lVar1].actions = actions;
    prVar2[lVar1].moves = moves;
    lVar1 = ftell((FILE *)loginfo.flog);
    checkpoints[(long)cpcount + -1].nexttoken = (int)lVar1;
    pnVar3 = clone_optlist(options);
    prVar2 = checkpoints;
    lVar1 = (long)cpcount;
    checkpoints[lVar1 + -1].opt = pnVar3;
    mnew(&prVar2[lVar1 + -1].cpdata,(memfile *)0x0);
    savegame(&checkpoints[(long)cpcount + -1].cpdata);
    prVar2 = checkpoints;
    lVar1 = (long)cpcount;
    checkpoints[lVar1 + -1].cpdata.len = checkpoints[lVar1 + -1].cpdata.pos;
    prVar2[lVar1 + -1].cpdata.pos = 0;
  }
  return;
}

Assistant:

static void make_checkpoint(int actions)
{
    /* only make a checkpoint if enough actions have happened since the last
     * one and creating a checkpoint is safe */
    if ((cpcount > 0 && (actions <= checkpoints[cpcount-1].actions + 1000 ||
	                 true_moves() <= checkpoints[cpcount-1].moves)) ||
	multi || occupation) /* checkpointing while something is in progress doesn't work */
	return;

    replay_sync_save();

    cpcount++;
    checkpoints = realloc(checkpoints, sizeof(struct replay_checkpoint) * cpcount);
    checkpoints[cpcount-1].actions = actions;
    checkpoints[cpcount-1].moves = moves;
    checkpoints[cpcount-1].nexttoken = ftell(loginfo.flog);
    /* the active option list must be saved: it is not part of the normal binary save */
    checkpoints[cpcount-1].opt = clone_optlist(options);
    mnew(&checkpoints[cpcount-1].cpdata, NULL);
    savegame(&checkpoints[cpcount-1].cpdata);
    checkpoints[cpcount-1].cpdata.len = checkpoints[cpcount-1].cpdata.pos;
    checkpoints[cpcount-1].cpdata.pos = 0;
}